

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O2

int __thiscall
actorpp::detail::ActorImpl::
wait<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>
          (ActorImpl *this,Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c,
          Channel<actorpp::CloseReason> *c_1)

{
  anon_class_24_3_4e947749 __p;
  int i;
  unique_lock<std::mutex> lock;
  int local_4c;
  int *local_48;
  Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *pCStack_40;
  Channel<actorpp::CloseReason> *local_38;
  unique_lock<std::mutex> local_30;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->mut);
  local_48 = &local_4c;
  __p.c = c;
  __p.i = local_48;
  __p._16_8_ = c_1;
  pCStack_40 = c;
  local_38 = c_1;
  std::condition_variable::
  wait<actorpp::detail::ActorImpl::wait<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>(actorpp::Channel<std::vector<unsigned_char,std::allocator<unsigned_char>>>&,actorpp::Channel<actorpp::CloseReason>&)::_lambda()_1_>
            (&this->cv,&local_30,__p);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return local_4c;
}

Assistant:

int wait(Channel<T> &...c) {
    std::unique_lock<std::mutex> lock(mut);
    int i;
    cv.wait(lock,
            [&]() { return (i = detail::readable_channel(0, c...)) != -1; });
    return i;
  }